

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void MapOptHandler_sky2(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  FMapInfoParser::ParseAssign(parse);
  FMapInfoParser::ParseLumpOrTextureName(parse,&info->SkyPic2);
  bVar1 = FMapInfoParser::CheckFloat(parse);
  if (bVar1) {
    if ((parse->HexenHack & 1U) != 0) {
      (parse->sc).Float = (parse->sc).Float / 256.0;
    }
    info->skyspeed2 = (float)((parse->sc).Float * 0.035);
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(sky2, true)
{
	parse.ParseAssign();
	parse.ParseLumpOrTextureName(info->SkyPic2);
	if (parse.CheckFloat())
	{
		if (parse.HexenHack)
		{
			parse.sc.Float /= 256;
		}
		info->skyspeed2 = float(parse.sc.Float * (35. / 1000.));
	}
}